

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall geemuboi::test::core::CpuTest_ld_d_d8_Test::TestBody(CpuTest_ld_d_d8_Test *this)

{
  undefined2 uVar1;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_00;
  char *message;
  linked_ptr<int> local_98;
  MatcherBase<unsigned_short> local_88;
  AssertionResult gtest_ar;
  Registers expected_regs;
  
  (this->super_CpuTest).regs.f = 0xf0;
  uVar1 = (this->super_CpuTest).regs.pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_88,uVar1 + 1);
  MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&expected_regs,&(this->super_CpuTest).mmu,
             (Matcher<unsigned_short> *)&local_88);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                      ((MockSpec<unsigned_char_(unsigned_short)> *)&expected_regs,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0x201,"mmu","read_byte(regs.pc + 1)");
  local_98.value_ = (int *)operator_new(4);
  *local_98.value_ = 0x33;
  local_98.link_.next_ = &local_98.link_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar,(ReturnAction *)&local_98);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (this_00,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar);
  testing::Action<unsigned_char_(unsigned_short)>::~Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar);
  testing::internal::linked_ptr<int>::~linked_ptr(&local_98);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&expected_regs.pc);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_88);
  CpuTest::execute_instruction(&this->super_CpuTest,'\x16');
  expected_regs.a = '\0';
  expected_regs.b = '\0';
  expected_regs.c = '\0';
  expected_regs.d = '3';
  expected_regs.e = '\0';
  expected_regs.h = '\0';
  expected_regs.l = '\0';
  expected_regs.f = 0xf0;
  expected_regs.pc = 2;
  expected_regs.sp = 0;
  CpuTest::verify_state_changes(&this->super_CpuTest,&expected_regs);
  local_88._vptr_MatcherBase._0_4_ =
       (*((this->super_CpuTest).cpu._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_98.value_ = (int *)CONCAT44(local_98.value_._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"cpu->get_cycles_executed()","2",(uint *)&local_88,
             (int *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x20b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CpuTest, ld_d_d8) {
    regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;

    EXPECT_CALL(mmu, read_byte(regs.pc + 1)).WillOnce(Return(0x33));

    execute_instruction(0x16);

    ICpu::Registers expected_regs{};
    expected_regs.d = 0x33;
    expected_regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;
    expected_regs.pc = 2;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}